

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmespath_custom_function_tests.cpp
# Opt level: O0

void __thiscall
myspace::
my_custom_functions<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
my_custom_functions(my_custom_functions<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                    *this)

{
  optional<unsigned_long> arity;
  optional<unsigned_long> arity_00;
  optional<unsigned_long> arity_01;
  optional<unsigned_long> arity_02;
  char *in_RDI;
  string_type *in_stack_fffffffffffffdf8;
  custom_functions<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *in_stack_fffffffffffffe00;
  custom_functions<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *this_00;
  _Storage<unsigned_long,_true> in_stack_fffffffffffffe08;
  _Storage<unsigned_long,_true> __f;
  function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_(jsoncons::detail::span<const_jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_18446744073709551615UL>,_jsoncons::jmespath::eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_&,_std::error_code_&)>
  *in_stack_fffffffffffffe10;
  function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_(jsoncons::detail::span<const_jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_18446744073709551615UL>,_jsoncons::jmespath::eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_&,_std::error_code_&)>
  *this_01;
  allocator<char> *in_stack_fffffffffffffe30;
  allocator<char> *__a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_02;
  custom_functions<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  local_1b0;
  undefined4 local_18c;
  allocator<char> local_171;
  string local_170 [40];
  function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_(jsoncons::detail::span<const_jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_18446744073709551615UL>,_jsoncons::jmespath::eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_&,_std::error_code_&)>
  local_148;
  undefined4 local_124;
  allocator<char> local_109;
  string local_108 [76];
  undefined4 local_bc;
  allocator<char> local_a1;
  string local_a0 [40];
  allocator<char> local_78 [36];
  undefined4 local_54;
  undefined1 local_29 [41];
  
  jsoncons::jmespath::
  custom_functions<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
  custom_functions((custom_functions<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                    *)0x4ab211);
  this_02 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_29;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_02,in_RDI,in_stack_fffffffffffffe30);
  local_54 = 0;
  std::optional<unsigned_long>::optional<int,_true>
            ((optional<unsigned_long> *)in_stack_fffffffffffffe00,(int *)in_stack_fffffffffffffdf8);
  __a = local_78;
  std::
  function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>(jsoncons::detail::span<jsoncons::jmespath::parameter<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const,18446744073709551615ul>,jsoncons::jmespath::eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>&,std::error_code&)>
  ::
  function<myspace::my_custom_functions<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::my_custom_functions()::_lambda(jsoncons::detail::span<jsoncons::jmespath::parameter<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const,18446744073709551615ul>,jsoncons::jmespath::eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>&,std::error_code&)_1_,void>
            (in_stack_fffffffffffffe10,(anon_class_1_0_00000001 *)in_stack_fffffffffffffe08);
  arity.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = in_stack_fffffffffffffe10;
  arity.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value =
       in_stack_fffffffffffffe08._M_value;
  jsoncons::jmespath::
  custom_functions<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
  register_function(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,arity,
                    (custom_function_type *)0x4ab29e);
  std::
  function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_(jsoncons::detail::span<const_jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_18446744073709551615UL>,_jsoncons::jmespath::eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_&,_std::error_code_&)>
  ::~function((function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_(jsoncons::detail::span<const_jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_18446744073709551615UL>,_jsoncons::jmespath::eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_&,_std::error_code_&)>
               *)0x4ab2ad);
  std::__cxx11::string::~string((string *)(local_29 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_02,in_RDI,__a);
  local_bc = 0;
  std::optional<unsigned_long>::optional<int,_true>
            ((optional<unsigned_long> *)in_stack_fffffffffffffe00,(int *)in_stack_fffffffffffffdf8);
  std::
  function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>(jsoncons::detail::span<jsoncons::jmespath::parameter<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const,18446744073709551615ul>,jsoncons::jmespath::eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>&,std::error_code&)>
  ::
  function<myspace::my_custom_functions<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::my_custom_functions()::_lambda(jsoncons::detail::span<jsoncons::jmespath::parameter<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const,18446744073709551615ul>,jsoncons::jmespath::eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>&,std::error_code&)_2_,void>
            (in_stack_fffffffffffffe10,(anon_class_1_0_00000001 *)in_stack_fffffffffffffe08);
  arity_00.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = in_stack_fffffffffffffe10;
  arity_00.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value =
       in_stack_fffffffffffffe08._M_value;
  jsoncons::jmespath::
  custom_functions<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
  register_function(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,arity_00,
                    (custom_function_type *)0x4ab354);
  std::
  function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_(jsoncons::detail::span<const_jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_18446744073709551615UL>,_jsoncons::jmespath::eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_&,_std::error_code_&)>
  ::~function((function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_(jsoncons::detail::span<const_jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_18446744073709551615UL>,_jsoncons::jmespath::eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_&,_std::error_code_&)>
               *)0x4ab363);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator(&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_02,in_RDI,__a);
  local_124 = 4;
  std::optional<unsigned_long>::optional<int,_true>
            ((optional<unsigned_long> *)in_stack_fffffffffffffe00,(int *)in_stack_fffffffffffffdf8);
  this_01 = &local_148;
  std::
  function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>(jsoncons::detail::span<jsoncons::jmespath::parameter<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const,18446744073709551615ul>,jsoncons::jmespath::eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>&,std::error_code&)>
  ::
  function<myspace::my_custom_functions<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::my_custom_functions()::_lambda(jsoncons::detail::span<jsoncons::jmespath::parameter<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const,18446744073709551615ul>,jsoncons::jmespath::eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>&,std::error_code&)_3_,void>
            (this_01,(anon_class_1_0_00000001 *)in_stack_fffffffffffffe08);
  arity_01.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = this_01;
  arity_01.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value =
       in_stack_fffffffffffffe08._M_value;
  jsoncons::jmespath::
  custom_functions<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
  register_function(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,arity_01,
                    (custom_function_type *)0x4ab40a);
  std::
  function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_(jsoncons::detail::span<const_jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_18446744073709551615UL>,_jsoncons::jmespath::eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_&,_std::error_code_&)>
  ::~function((function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_(jsoncons::detail::span<const_jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_18446744073709551615UL>,_jsoncons::jmespath::eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_&,_std::error_code_&)>
               *)0x4ab419);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator(&local_109);
  __f._M_value = (unsigned_long)&local_171;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_02,in_RDI,__a);
  local_18c = 2;
  std::optional<unsigned_long>::optional<int,_true>
            ((optional<unsigned_long> *)in_stack_fffffffffffffe00,(int *)in_stack_fffffffffffffdf8);
  this_00 = &local_1b0;
  std::
  function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>(jsoncons::detail::span<jsoncons::jmespath::parameter<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const,18446744073709551615ul>,jsoncons::jmespath::eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>&,std::error_code&)>
  ::
  function<myspace::my_custom_functions<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::my_custom_functions()::_lambda(jsoncons::detail::span<jsoncons::jmespath::parameter<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const,18446744073709551615ul>,jsoncons::jmespath::eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>&,std::error_code&)_4_,void>
            (this_01,(anon_class_1_0_00000001 *)__f);
  arity_02.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = this_01;
  arity_02.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = __f._M_value;
  jsoncons::jmespath::
  custom_functions<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
  register_function(this_00,in_stack_fffffffffffffdf8,arity_02,(custom_function_type *)0x4ab4b4);
  std::
  function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_(jsoncons::detail::span<const_jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_18446744073709551615UL>,_jsoncons::jmespath::eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_&,_std::error_code_&)>
  ::~function((function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_(jsoncons::detail::span<const_jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_18446744073709551615UL>,_jsoncons::jmespath::eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_&,_std::error_code_&)>
               *)0x4ab4c0);
  std::__cxx11::string::~string(local_170);
  std::allocator<char>::~allocator(&local_171);
  return;
}

Assistant:

my_custom_functions()
    {
        this->register_function("current_date_time", // function name
            0,                                       // number of arguments   
            [](const jsoncons::span<const jmespath::parameter<Json>>,
                jmespath::eval_context<Json>&,
                std::error_code&) -> Json
            {
                auto now = std::chrono::system_clock::now();
                auto milliseconds = std::chrono::duration_cast<std::chrono::milliseconds>(now.time_since_epoch());
                return Json{milliseconds.count()};
            }
        );
        this->register_function("current_index", // function name
            0,                                   // number of arguments   
            [](const jsoncons::span<const jmespath::parameter<Json>>,
                jmespath::eval_context<Json>&,
                std::error_code&) -> Json
            {
                return Json{current_index};
            }
        );
        this->register_function("generate_array", // function name
            4,                                    // number of arguments   
            [](const jsoncons::span<const jmespath::parameter<Json>> params,
                jmespath::eval_context<Json>& context,
                std::error_code& ec) -> Json
            {
                JSONCONS_ASSERT(4 == params.size());

                if (!(params[0].is_value() && params[2].is_expression()))
                {
                    ec = jmespath::jmespath_errc::invalid_argument;
                    return context.null_value();
                }

                reference ctx = params[0].value();
                reference countValue = get_value(ctx, context, params[1]);
                const auto& expr = params[2].expression();
                const auto& argDefault = params[3];

                if (!countValue.is_number())
                {
                    ec = jmespath::jmespath_errc::invalid_argument;
                    return context.null_value();
                }

                Json result{jsoncons::json_array_arg};
                std::size_t count = countValue.template as<std::size_t>();
                for (size_t i = 0; i < count; i++)
                {
                    current_index = i;
                    std::error_code ec2;

                    reference ele = expr.evaluate(ctx, context, ec2); 

                    if (ele.is_null())
                    {
                        auto defaultVal = get_value(ctx, context, argDefault);
                        result.emplace_back(std::move(defaultVal));
                    }
                    else
                    {
                        result.emplace_back(ele);
                    }
                }
                current_index = 0;

                return result;
            }
        );
        this->register_function("add", // function name
            2,                         // number of arguments   
            [](jsoncons::span<const jmespath::parameter<Json>> params,
                jmespath::eval_context<Json>& context,
                std::error_code& ec) -> Json
            {
                JSONCONS_ASSERT(2 == params.size());

                if (!(params[0].is_value() && params[1].is_value()))
                {
                    ec = jmespath::jmespath_errc::invalid_argument;
                    return context.null_value();
                }

                reference arg0 = params[0].value();
                reference arg1 = params[1].value();
                if (!(arg0.is_number() && arg1.is_number()))
                {
                    ec = jmespath::jmespath_errc::invalid_argument;
                    return context.null_value();
                }

                if (arg0.template is<int64_t>() && arg1.template is<int64_t>())
                {
                    int64_t v = arg0.template as<int64_t>() + arg1.template as<int64_t>();
                    return Json(v);
                }
                else
                {
                    double v = arg0.template as<double>() + arg1.template as<double>();
                    return Json(v);
                }
            }
        );
    }